

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O0

int __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::vSolveUright(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *this,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *vec,int *vidx,
              number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *rhs,int *ridx,int rn,
              number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *eps)

{
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar1;
  bool bVar2;
  type_conflict5 tVar3;
  int iVar4;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  int *in_R8;
  int in_R9D;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_00000008;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *val;
  int *idx;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  y;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  x;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *cval;
  int *cbeg;
  int *clen;
  int *cidx;
  int *rperm;
  int *corig;
  int *rorig;
  int n;
  int c;
  int r;
  int k;
  int j;
  int i;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_5;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_5;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_4;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_4;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_3;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_3;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_2;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_2;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_1;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_1;
  cpp_dec_float<200U,_int,_void> *in_stack_fffffffffffff5a8;
  cpp_dec_float<200U,_int,_void> *in_stack_fffffffffffff5b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar5;
  self_type *in_stack_fffffffffffff5c8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff5d0;
  undefined1 local_9b8 [96];
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff6a8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff6b0;
  undefined1 local_938 [128];
  undefined4 local_8b8;
  undefined1 local_8b4 [128];
  undefined4 local_834;
  cpp_dec_float<200U,_int,_void> *local_830;
  undefined1 local_828 [128];
  undefined1 local_7a8 [128];
  undefined1 local_728 [128];
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_6a8;
  undefined1 local_628 [128];
  undefined4 local_5a8;
  undefined1 local_5a4 [128];
  undefined1 local_524 [128];
  undefined4 local_4a4;
  undefined1 local_4a0 [128];
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_420;
  int *local_418;
  undefined1 local_410 [128];
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_390;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_310;
  long local_308;
  long local_300;
  long local_2f8;
  long local_2f0;
  long local_2e8;
  long local_2e0;
  int local_2d4;
  int local_2d0;
  int local_2cc;
  int local_2c8;
  int local_2c4;
  int local_2c0;
  int local_2bc;
  int *local_2b8;
  long local_2b0;
  long local_2a8;
  long local_2a0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_290;
  undefined1 *local_288;
  undefined4 *local_280;
  long local_278;
  undefined4 *local_270;
  long local_268;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_260;
  undefined1 *local_258;
  undefined1 *local_248;
  undefined1 *local_240;
  undefined1 *local_238;
  undefined1 *local_228;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_220;
  undefined1 *local_218;
  undefined1 *local_208;
  undefined1 *local_200;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1f8;
  undefined1 *local_1f0;
  undefined1 *local_1e8;
  undefined1 *local_1e0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1d8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1d0;
  long local_1c8;
  undefined1 *local_1c0;
  long local_1b8;
  undefined1 *local_1b0;
  long local_1a8;
  long local_1a0;
  undefined1 *local_198;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_190;
  long local_188;
  undefined4 *local_180;
  undefined4 *local_178;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_169;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_168;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_160;
  undefined1 *local_158;
  undefined1 *local_150;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_148;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_140;
  undefined1 *local_138;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_129;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_128;
  reference local_120;
  undefined1 *local_118;
  undefined1 *local_110;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_108;
  reference local_100;
  undefined1 *local_f8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_e9;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_e8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_e0;
  undefined1 *local_d8;
  undefined1 *local_d0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_c8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_c0;
  undefined1 *local_b8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_a9;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_a8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_a0;
  undefined1 *local_98;
  undefined1 *local_90;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_88;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_80;
  undefined1 *local_78;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_69;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_68;
  reference local_60;
  undefined1 *local_58;
  undefined1 *local_50;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_48;
  reference local_40;
  undefined1 *local_38;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_29;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_28;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_20;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_18;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_10;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_8;
  
  local_290 = &local_390;
  local_2bc = in_R9D;
  local_2b8 = in_R8;
  local_2b0 = in_RCX;
  local_2a8 = in_RDX;
  local_2a0 = in_RSI;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
            (in_stack_fffffffffffff5b0);
  local_288 = local_410;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
            (in_stack_fffffffffffff5b0);
  local_2e0 = *(long *)(in_RDI + 0x290);
  local_2e8 = *(long *)(in_RDI + 0x2a0);
  local_2f0 = *(long *)(in_RDI + 0x298);
  local_2f8 = *(long *)(in_RDI + 0x3d8);
  local_310 = std::
              vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ::data((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      *)0x6e2f50);
  local_300 = *(long *)(in_RDI + 0x400);
  local_308 = *(long *)(in_RDI + 0x3f8);
  local_2d4 = 0;
  pnVar5 = in_stack_00000008;
  do {
    do {
      if (local_2bc < 1) {
        return local_2d4;
      }
      local_2c0 = deQueueMax(local_2b8,&local_2bc);
      local_2cc = *(int *)(local_2e0 + (long)local_2c0 * 4);
      local_60 = std::
                 vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ::operator[]((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                               *)(in_RDI + 0x338),(long)local_2cc);
      local_68 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)(local_2b0 + (long)local_2cc * 0x80);
      local_58 = local_4a0;
      boost::multiprecision::detail::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
      ::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (&local_69,local_60,local_68);
      local_50 = local_4a0;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                (in_stack_fffffffffffff5b0);
      local_38 = local_4a0;
      local_40 = local_60;
      local_48 = local_68;
      boost::multiprecision::default_ops::
      eval_multiply<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                (in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8,
                 (cpp_dec_float<200U,_int,_void> *)0x6e30a7);
      local_1d8 = &local_390;
      local_1e0 = local_4a0;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                (in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8);
      local_4a4 = 0;
      local_268 = local_2b0 + (long)local_2cc * 0x80;
      local_270 = &local_4a4;
      local_180 = local_270;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                (in_stack_fffffffffffff5b0,(long_long_type)in_stack_fffffffffffff5a8);
      local_258 = local_524;
      local_260 = &local_390;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                (in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8);
      local_248 = local_5a4;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                (in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8);
      bVar2 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (in_stack_fffffffffffff6b0,in_stack_fffffffffffff6a8);
    } while (!bVar2);
    local_2d0 = *(int *)(local_2e8 + (long)local_2c0 * 4);
    *(int *)(local_2a8 + (long)local_2d4 * 4) = local_2d0;
    local_188 = local_2a0 + (long)local_2d0 * 0x80;
    local_190 = &local_390;
    local_2d4 = local_2d4 + 1;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
              (in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8);
    local_420 = local_310 + *(int *)(local_308 + (long)local_2d0 * 4);
    local_418 = (int *)(local_2f8 + (long)*(int *)(local_308 + (long)local_2d0 * 4) * 4);
    local_2c4 = *(int *)(local_300 + (long)local_2d0 * 4);
    while (iVar4 = local_2c4 + -1, 0 < local_2c4) {
      local_2c8 = *local_418;
      local_1a0 = local_2b0 + (long)local_2c8 * 0x80;
      local_198 = local_410;
      local_418 = local_418 + 1;
      local_2c4 = iVar4;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                (in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8);
      local_5a8 = 0;
      tVar3 = boost::multiprecision::operator==(pnVar5,(int *)in_stack_fffffffffffff5b0);
      pnVar1 = local_420;
      if (tVar3) {
        local_20 = &local_6a8;
        local_28 = &local_390;
        boost::multiprecision::detail::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
        ::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  (&local_29,local_28);
        local_10 = &local_6a8;
        local_18 = local_28;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                  (in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8);
        local_8 = &local_6a8;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::negate
                  (in_stack_fffffffffffff5b0);
        pnVar1 = local_420;
        local_98 = local_628;
        local_a0 = &local_6a8;
        local_a8 = local_420;
        local_420 = local_420 + 1;
        boost::multiprecision::detail::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
        ::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  (&local_a9,local_a0,pnVar1);
        local_90 = local_628;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                  (in_stack_fffffffffffff5b0);
        local_78 = local_628;
        local_80 = local_a0;
        local_88 = local_a8;
        boost::multiprecision::default_ops::
        eval_multiply<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  (in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8,
                   (cpp_dec_float<200U,_int,_void> *)0x6e34b2);
        local_1e8 = local_410;
        local_1f0 = local_628;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                  (in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8);
        local_238 = local_728;
        local_240 = local_410;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                  (in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8);
        local_228 = local_7a8;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                  (in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8);
        bVar2 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                          (in_stack_fffffffffffff6b0,in_stack_fffffffffffff6a8);
        if (bVar2) {
          local_1a8 = local_2b0 + (long)local_2c8 * 0x80;
          local_1b0 = local_410;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                    (in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8);
          enQueueMax(local_2b8,&local_2bc,*(int *)(local_2f0 + (long)local_2c8 * 4));
        }
      }
      else {
        local_d8 = local_828;
        local_e0 = &local_390;
        local_e8 = local_420;
        local_420 = local_420 + 1;
        boost::multiprecision::detail::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
        ::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  (&local_e9,local_e0,pnVar1);
        local_d0 = local_828;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                  (in_stack_fffffffffffff5b0);
        local_b8 = local_828;
        local_c0 = local_e0;
        local_c8 = local_e8;
        boost::multiprecision::default_ops::
        eval_multiply<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  (in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8,
                   (cpp_dec_float<200U,_int,_void> *)0x6e36a3);
        boost::multiprecision::
        number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
        ::operator-=(in_stack_fffffffffffff5d0,in_stack_fffffffffffff5c8);
        local_834 = 0;
        tVar3 = boost::multiprecision::operator==(pnVar5,(int *)in_stack_fffffffffffff5b0);
        in_stack_fffffffffffff5a8 = (cpp_dec_float<200U,_int,_void> *)0x0;
        in_stack_fffffffffffff5b0 = (cpp_dec_float<200U,_int,_void> *)0x2b2bff2ee48e0530;
        if (!tVar3) {
          in_stack_fffffffffffff5b0 = (cpp_dec_float<200U,_int,_void> *)0x0;
        }
        local_830 = in_stack_fffffffffffff5b0;
        boost::multiprecision::
        number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>
        ::operator+=(pnVar5,(double *)in_stack_fffffffffffff5b0);
        local_1b8 = local_2b0 + (long)local_2c8 * 0x80;
        local_1c0 = local_410;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                  (in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8);
      }
    }
    local_2c4 = iVar4;
  } while ((double)local_2bc <= (double)local_2c0 * 0.2);
  for (local_2c0 = *local_2b8; -1 < local_2c0; local_2c0 = local_2c0 + -1) {
    local_2cc = *(int *)(local_2e0 + (long)local_2c0 * 4);
    local_120 = std::
                vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ::operator[]((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              *)(in_RDI + 0x338),(long)local_2cc);
    local_128 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)(local_2b0 + (long)local_2cc * 0x80);
    local_118 = local_8b4;
    boost::multiprecision::detail::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
    ::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
              (&local_129,local_120,local_128);
    local_110 = local_8b4;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
              (in_stack_fffffffffffff5b0);
    local_f8 = local_8b4;
    local_100 = local_120;
    local_108 = local_128;
    boost::multiprecision::default_ops::
    eval_multiply<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
              (in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8,
               (cpp_dec_float<200U,_int,_void> *)0x6e38a5);
    local_1f8 = &local_390;
    local_200 = local_8b4;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
              (in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8);
    local_8b8 = 0;
    local_278 = local_2b0 + (long)local_2cc * 0x80;
    local_280 = &local_8b8;
    local_178 = local_280;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
              (in_stack_fffffffffffff5b0,(long_long_type)in_stack_fffffffffffff5a8);
    local_218 = local_938;
    local_220 = &local_390;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
              (in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8);
    local_208 = local_9b8;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
              (in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8);
    bVar2 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      (in_stack_fffffffffffff6b0,in_stack_fffffffffffff6a8);
    if (bVar2) {
      local_2d0 = *(int *)(local_2e8 + (long)local_2c0 * 4);
      *(int *)(local_2a8 + (long)local_2d4 * 4) = local_2d0;
      local_1c8 = local_2a0 + (long)local_2d0 * 0x80;
      local_1d0 = &local_390;
      local_2d4 = local_2d4 + 1;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                (in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8);
      local_420 = local_310 + *(int *)(local_308 + (long)local_2d0 * 4);
      local_418 = (int *)(local_2f8 + (long)*(int *)(local_308 + (long)local_2d0 * 4) * 4);
      local_2c4 = *(int *)(local_300 + (long)local_2d0 * 4);
      while (pnVar5 = local_420, iVar4 = local_2c4 + -1, bVar2 = 0 < local_2c4, local_2c4 = iVar4,
            bVar2) {
        local_158 = &stack0xfffffffffffff5c8;
        local_160 = &local_390;
        local_168 = local_420;
        local_420 = local_420 + 1;
        boost::multiprecision::detail::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
        ::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  (&local_169,local_160,pnVar5);
        local_150 = &stack0xfffffffffffff5c8;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                  (in_stack_fffffffffffff5b0);
        local_138 = &stack0xfffffffffffff5c8;
        local_140 = local_160;
        local_148 = local_168;
        boost::multiprecision::default_ops::
        eval_multiply<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  (in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8,
                   (cpp_dec_float<200U,_int,_void> *)0x6e3b93);
        local_418 = local_418 + 1;
        boost::multiprecision::
        number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
        ::operator-=(in_stack_fffffffffffff5d0,in_stack_fffffffffffff5c8);
      }
    }
  }
  return local_2d4;
}

Assistant:

int CLUFactor<R>::vSolveUright(R* vec, int* vidx,
                               R* rhs, int* ridx, int rn, R eps)
{
   int i, j, k, r, c, n;
   int* rorig, *corig;
   int* rperm;
   int* cidx, *clen, *cbeg;
   R* cval;
   R x, y;

   int* idx;
   R* val;

   rorig = row.orig;
   corig = col.orig;
   rperm = row.perm;

   cidx = u.col.idx;
   cval = u.col.val.data();
   clen = u.col.len;
   cbeg = u.col.start;

   n = 0;

   while(rn > 0)
   {
      /*      Find nonzero with highest permuted row index and setup i and r
       */
      i = deQueueMax(ridx, &rn);
      assert(i >= 0 && i < thedim);
      r = rorig[i];
      assert(r >= 0 && r < thedim);

      x = diag[r] * rhs[r];
      rhs[r] = 0;

      if(isNotZero(x, eps))
      {
         c = corig[i];
         assert(c >= 0 && c < thedim);
         vidx[n++] = c;
         vec[c] = x;
         val = &cval[cbeg[c]];
         idx = &cidx[cbeg[c]];
         j = clen[c];

         while(j-- > 0)
         {
            assert(*idx >= 0 && *idx < thedim);
            k = *idx++;
            assert(k >= 0 && k < thedim);
            y = rhs[k];

            if(y == 0)
            {
               y = -x * (*val++);

               if(isNotZero(y, eps))
               {
                  rhs[k] = y;
                  enQueueMax(ridx, &rn, rperm[k]);
               }
            }
            else
            {
               y -= x * (*val++);
               y += (y == 0) ? SOPLEX_FACTOR_MARKER : 0;
               rhs[k] = y;
            }
         }

         if(rn > i * verySparseFactor4right)
         {
            /* continue with dense case */
            for(i = *ridx; i >= 0; --i)
            {
               r = rorig[i];
               assert(r >= 0 && r < thedim);
               x = diag[r] * rhs[r];
               rhs[r] = 0;

               if(isNotZero(x, eps))
               {
                  c = corig[i];
                  assert(c >= 0 && c < thedim);
                  vidx[n++] = c;
                  vec[c] = x;
                  val = &cval[cbeg[c]];
                  idx = &cidx[cbeg[c]];
                  j = clen[c];

                  while(j-- > 0)
                  {
                     assert(*idx >= 0 && *idx < thedim);
                     rhs[*idx++] -= x * (*val++);
                  }
               }
            }

            break;
         }
      }
   }

   return n;
}